

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration
          (ValidationState_t *this,Instruction *inst)

{
  ushort uVar1;
  pointer psVar2;
  pointer puVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_bool>
  pVar7;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> key;
  
  key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c = (uint)(inst->inst_).opcode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&key,&local_4c);
  lVar5 = 4;
  uVar6 = 0;
  do {
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar6) {
      pVar7 = std::
              _Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::_Identity<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ::_M_insert_unique<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::_Identity<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          *)&this->unique_type_declarations_,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return (bool)(pVar7.second & 1);
    }
    if (*(int *)((long)&psVar2->offset + lVar5) != 3) {
      uVar1 = *(ushort *)((long)psVar2 + lVar5 + -4);
      uVar4 = (uint)*(ushort *)((long)psVar2 + lVar5 + -2) + (uint)uVar1;
      puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2) <
          (int)uVar4) {
        __assert_fail("words_end <= static_cast<int>(inst->words().size())",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x34e,
                      "bool spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction *)"
                     );
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&key,
                 (const_iterator)
                 key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar3 + uVar1),
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar3 + uVar4));
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

bool ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction* inst) {
  std::vector<uint32_t> key;
  key.push_back(static_cast<uint32_t>(inst->opcode()));
  for (size_t index = 0; index < inst->operands().size(); ++index) {
    const spv_parsed_operand_t& operand = inst->operand(index);

    if (operand.type == SPV_OPERAND_TYPE_RESULT_ID) continue;

    const int words_begin = operand.offset;
    const int words_end = words_begin + operand.num_words;
    assert(words_end <= static_cast<int>(inst->words().size()));

    key.insert(key.end(), inst->words().begin() + words_begin,
               inst->words().begin() + words_end);
  }

  return unique_type_declarations_.insert(std::move(key)).second;
}